

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

AnnotatedHandler * __thiscall
capnp::JsonCodec::loadAnnotatedHandler
          (JsonCodec *this,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  Impl *pIVar1;
  Entry *pEVar2;
  Own<capnp::JsonCodec::AnnotatedHandler> *t;
  Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> **ppMVar3;
  Fault local_c8;
  Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> local_c0;
  Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *local_b8;
  Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *_kj_result;
  Schema local_a0;
  AnnotatedHandler *result;
  Own<capnp::JsonCodec::AnnotatedHandler> newHandler;
  Own<capnp::JsonCodec::AnnotatedHandler> *v;
  anon_class_8_1_6b0526df local_70;
  Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> local_68;
  JsonCodec *local_58;
  Type local_50;
  Entry *local_40;
  Entry *entry;
  Vector<capnp::Schema> *dependencies_local;
  Maybe<kj::StringPtr> *unionDeclName_local;
  Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator_local;
  JsonCodec *this_local;
  StructSchema schema_local;
  
  entry = (Entry *)dependencies;
  dependencies_local = (Vector<capnp::Schema> *)unionDeclName;
  unionDeclName_local = (Maybe<kj::StringPtr> *)discriminator;
  discriminator_local = (Maybe<capnp::json::DiscriminatorOptions::Reader> *)this;
  this_local = (JsonCodec *)schema.super_Schema.raw;
  pIVar1 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
  local_58 = this_local;
  capnp::Type::Type(&local_50,(StructSchema)this_local);
  kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>::Maybe(&local_68,(void *)0x0);
  local_70.schema = (StructSchema *)&this_local;
  pEVar2 = kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
           upsert<capnp::JsonCodec::loadAnnotatedHandler(capnp::StructSchema,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>,kj::Maybe<kj::StringPtr>,kj::Vector<capnp::Schema>&)::__0>
                     ((HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>> *
                      )&pIVar1->annotatedHandlers,local_50,&local_68,&local_70);
  kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>::~Maybe(&local_68);
  local_40 = pEVar2;
  newHandler.ptr =
       (AnnotatedHandler *)kj::_::readMaybe<capnp::JsonCodec::AnnotatedHandler>(&pEVar2->value);
  if (newHandler.ptr == (AnnotatedHandler *)0x0) {
    kj::
    heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
              ((kj *)&result,this,(StructSchema *)&this_local,discriminator,unionDeclName,
               (Vector<capnp::Schema> *)entry);
    local_a0.raw = (RawBrandedSchema *)
                   kj::Own<capnp::JsonCodec::AnnotatedHandler>::operator*
                             ((Own<capnp::JsonCodec::AnnotatedHandler> *)&result);
    t = kj::mv<kj::Own<capnp::JsonCodec::AnnotatedHandler>>
                  ((Own<capnp::JsonCodec::AnnotatedHandler> *)&result);
    kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>::Maybe
              ((Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)&_kj_result,t);
    pIVar1 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
    local_c0 = kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
               find<capnp::StructSchema&>
                         ((HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>
                           *)&pIVar1->annotatedHandlers,(StructSchema *)&this_local);
    local_b8 = kj::_::readMaybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>(&local_c0);
    if (local_b8 == (Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x59e,FAILED,"impl->annotatedHandlers.find(schema) != nullptr","");
      kj::_::Debug::Fault::fatal(&local_c8);
    }
    ppMVar3 = kj::mv<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>*>(&local_b8);
    kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>::operator=
              (*ppMVar3,(Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)&_kj_result);
    kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>::~Maybe
              ((Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)&_kj_result);
    addTypeHandler(this,(StructSchema)this_local,
                   (Handler<capnp::DynamicStruct,_(capnp::Style)2> *)local_a0.raw);
    schema_local.super_Schema.raw = (Schema)(Schema)local_a0.raw;
    kj::Own<capnp::JsonCodec::AnnotatedHandler>::~Own
              ((Own<capnp::JsonCodec::AnnotatedHandler> *)&result);
  }
  else {
    schema_local.super_Schema.raw =
         (Schema)kj::Own<capnp::JsonCodec::AnnotatedHandler>::operator*
                           ((Own<capnp::JsonCodec::AnnotatedHandler> *)newHandler.ptr);
  }
  return (AnnotatedHandler *)schema_local.super_Schema.raw.raw;
}

Assistant:

JsonCodec::AnnotatedHandler& JsonCodec::loadAnnotatedHandler(
      StructSchema schema, kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
      kj::Maybe<kj::StringPtr> unionDeclName, kj::Vector<Schema>& dependencies) {
  auto& entry = impl->annotatedHandlers.upsert(schema, nullptr,
      [&](kj::Maybe<kj::Own<AnnotatedHandler>>& existing, auto dummy) {
    KJ_ASSERT(existing != nullptr,
        "cyclic JSON flattening detected", schema.getProto().getDisplayName());
  });

  KJ_IF_MAYBE(v, entry.value) {
    // Already exists.
    return **v;
  } else {
    // Not seen before.
    auto newHandler = kj::heap<AnnotatedHandler>(
          *this, schema, discriminator, unionDeclName, dependencies);
    auto& result = *newHandler;

    // Map may have changed, so we have to look up again.
    KJ_ASSERT_NONNULL(impl->annotatedHandlers.find(schema)) = kj::mv(newHandler);

    addTypeHandler(schema, result);
    return result;
  }